

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acutest.h
# Opt level: O1

int acutest_cmdline_callback_(int id,char *arg)

{
  byte bVar1;
  acutest_test_data_ *paVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  void *pvVar6;
  char *pcVar7;
  long lVar8;
  uint uVar9;
  ulong uVar10;
  undefined1 uVar11;
  bool bVar12;
  bool bVar13;
  int local_60;
  
  if (id < 0x58) {
    if (0x44 < id) {
      if (id == 0x45) {
        acutest_no_exec_ = 1;
        return 0;
      }
      if (id != 0x53) {
        if (id == 0x54) {
          acutest_tap_ = 1;
          return 0;
        }
        return 0;
      }
      acutest_no_summary_ = 1;
      return 0;
    }
LAB_00103c79:
    uVar11 = id == 0;
    if (id < 0) {
      if (id == -0x7fffffff) {
        acutest_cmdline_callback__cold_2();
      }
      else if (id != -0x7ffffffe) {
        uVar11 = id == -0x7ffffffd;
        if (!(bool)uVar11) {
          return 0;
        }
        pcVar7 = arg;
        acutest_cmdline_callback__cold_6();
        id = (int)pcVar7;
        goto LAB_00103ca9;
      }
      acutest_cmdline_callback__cold_1();
switchD_00103c25_caseD_6c:
      acutest_list_names_();
LAB_00103fb7:
      acutest_exit_(0);
    }
LAB_00103ca9:
    bVar1 = acutest_list_size_;
    if ((bool)uVar11) {
      uVar9 = (uint)acutest_list_size_ * 4;
      if (acutest_list_size_ == 1) {
        lVar8 = 0;
        uVar10 = (ulong)uVar9;
        do {
          iVar3 = strcmp(*(char **)((long)&acutest_list_[0].name + lVar8),arg);
          paVar2 = acutest_test_data_;
          if (iVar3 == 0) {
            *(undefined4 *)((long)&acutest_test_data_->state + lVar8) = 0xfffffffd;
            local_60 = 1;
            goto LAB_00103f83;
          }
          lVar8 = lVar8 + 0x10;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        uVar10 = 0;
        local_60 = 0;
        do {
          pcVar7 = acutest_list_[uVar10].name;
          sVar4 = strlen(arg);
          for (pcVar5 = strstr(pcVar7,arg); pcVar5 != (char *)0x0; pcVar5 = strstr(pcVar5 + 1,arg))
          {
            bVar13 = true;
            bVar12 = true;
            if (pcVar5 != pcVar7) {
              pvVar6 = memchr(acutest_name_contains_word__word_delim,(int)pcVar5[-1],10);
              bVar12 = pvVar6 != (void *)0x0;
            }
            if (pcVar5[sVar4] != '\0') {
              pvVar6 = memchr(acutest_name_contains_word__word_delim,(int)pcVar5[sVar4],10);
              bVar13 = pvVar6 != (void *)0x0;
            }
            if ((bool)(bVar12 & bVar13)) {
              paVar2[uVar10].state = ACUTEST_STATE_SELECTED;
              local_60 = local_60 + 1;
              break;
            }
          }
          uVar10 = uVar10 + 1;
        } while (uVar10 != uVar9);
      }
      else {
        local_60 = 0;
      }
      paVar2 = acutest_test_data_;
      if (bVar1 == 1 && local_60 < 1) {
        uVar10 = (ulong)uVar9;
        lVar8 = 0;
        do {
          pcVar7 = strstr(*(char **)((long)&acutest_list_[0].name + lVar8),arg);
          if (pcVar7 != (char *)0x0) {
            *(undefined4 *)((long)&paVar2->state + lVar8) = 0xfffffffd;
            local_60 = local_60 + 1;
          }
          lVar8 = lVar8 + 0x10;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
      }
LAB_00103f83:
      if (local_60 == 0) {
        acutest_cmdline_callback__cold_3();
      }
      return 0;
    }
    if (id != 0x43) {
      return 0;
    }
LAB_00103cb8:
    acutest_colorize_ = 0;
  }
  else {
    switch(id) {
    case 0x71:
      acutest_verbose_level_ = 0;
      break;
    case 0x72:
    case 0x73:
    case 0x74:
    case 0x75:
      break;
    case 0x76:
      if (arg == (char *)0x0) {
        acutest_verbose_level_ = acutest_verbose_level_ + 1;
      }
      else {
        acutest_verbose_level_ = atoi(arg);
      }
      break;
    case 0x78:
      acutest_xml_output_ = (FILE *)fopen(arg,"w");
      if ((FILE *)acutest_xml_output_ != (FILE *)0x0) {
        return 0;
      }
      acutest_cmdline_callback__cold_4();
    case 0x77:
      acutest_worker_ = 1;
      acutest_worker_index_ = atoi(arg);
      break;
    default:
      switch(id) {
      case 99:
        if ((arg == (char *)0x0) || (iVar3 = strcmp(arg,"always"), iVar3 == 0)) {
          acutest_colorize_ = 1;
          return 0;
        }
        iVar3 = strcmp(arg,"never");
        if (iVar3 != 0) {
          iVar3 = strcmp(arg,"auto");
          if (iVar3 == 0) {
            return 0;
          }
          pcVar7 = arg;
          acutest_cmdline_callback__cold_5();
          id = (int)pcVar7;
          goto LAB_00103c79;
        }
        goto LAB_00103cb8;
      case 100:
      case 0x66:
      case 0x67:
      case 0x69:
      case 0x6a:
      case 0x6b:
        break;
      case 0x65:
        if ((arg == (char *)0x0) || (iVar3 = strcmp(arg,"always"), iVar3 == 0)) {
          acutest_no_exec_ = 0;
          return 0;
        }
        iVar3 = strcmp(arg,"never");
        if (iVar3 == 0) {
          acutest_no_exec_ = 1;
          return 0;
        }
        iVar3 = strcmp(arg,"auto");
        if (iVar3 != 0) {
          acutest_cmdline_callback__cold_7();
          acutest_no_exec_ = 1;
          return 0;
        }
        return 0;
      case 0x68:
        acutest_help_();
        goto LAB_00103fb7;
      case 0x6c:
        goto switchD_00103c25_caseD_6c;
      default:
        if (id == 0x58) {
          acutest_exclude_mode_ = 1;
        }
      }
    }
  }
  return 0;
}

Assistant:

static int
acutest_cmdline_callback_(int id, const char* arg)
{
    switch(id) {
        case 'X':
            acutest_exclude_mode_ = 1;
            break;

        case 'e':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_no_exec_ = 0;
            } else if(strcmp(arg, "never") == 0) {
                acutest_no_exec_ = 1;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --exec.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'E':
            acutest_no_exec_ = 1;
            break;

        case 't':
#if defined ACUTEST_WIN_  ||  defined ACUTEST_HAS_POSIX_TIMER_
            if(arg == NULL || strcmp(arg, "real") == 0) {
                acutest_timer_ = 1;
    #ifndef ACUTEST_WIN_
            } else if(strcmp(arg, "cpu") == 0) {
                acutest_timer_ = 2;
    #endif
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --time.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
#endif
            break;

        case 'S':
            acutest_no_summary_ = 1;
            break;

        case 'T':
            acutest_tap_ = 1;
            break;

        case 'l':
            acutest_list_names_();
            acutest_exit_(0);
            break;

        case 'v':
            acutest_verbose_level_ = (arg != NULL ? atoi(arg) : acutest_verbose_level_+1);
            break;

        case 'q':
            acutest_verbose_level_ = 0;
            break;

        case 'c':
            if(arg == NULL || strcmp(arg, "always") == 0) {
                acutest_colorize_ = 1;
            } else if(strcmp(arg, "never") == 0) {
                acutest_colorize_ = 0;
            } else if(strcmp(arg, "auto") == 0) {
                /*noop*/
            } else {
                fprintf(stderr, "%s: Unrecognized argument '%s' for option --color.\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case 'C':
            acutest_colorize_ = 0;
            break;

        case 'h':
            acutest_help_();
            acutest_exit_(0);
            break;

        case 'w':
            acutest_worker_ = 1;
            acutest_worker_index_ = atoi(arg);
            break;
        case 'x':
            acutest_xml_output_ = fopen(arg, "w");
            if (!acutest_xml_output_) {
                fprintf(stderr, "Unable to open '%s': %s\n", arg, strerror(errno));
                acutest_exit_(2);
            }
            break;

        case 0:
            if(acutest_select_(arg) == 0) {
                fprintf(stderr, "%s: Unrecognized unit test '%s'\n", acutest_argv0_, arg);
                fprintf(stderr, "Try '%s --list' for list of unit tests.\n", acutest_argv0_);
                acutest_exit_(2);
            }
            break;

        case ACUTEST_CMDLINE_OPTID_UNKNOWN_:
            fprintf(stderr, "Unrecognized command line option '%s'.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_MISSINGARG_:
            fprintf(stderr, "The command line option '%s' requires an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;

        case ACUTEST_CMDLINE_OPTID_BOGUSARG_:
            fprintf(stderr, "The command line option '%s' does not expect an argument.\n", arg);
            fprintf(stderr, "Try '%s --help' for more information.\n", acutest_argv0_);
            acutest_exit_(2);
            break;
    }

    return 0;
}